

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::FindCMakeResources(char *argv0)

{
  bool bVar1;
  string_view str;
  string dir;
  string exe_dir;
  string prefix;
  string src_dir;
  string local_4a8;
  string exe;
  string src_dir_txt;
  string errorMsg;
  ifstream fin2;
  byte abStack_408 [488];
  ifstream fin;
  byte abStack_200 [488];
  
  exe_dir._M_dataplus._M_p = (pointer)&exe_dir.field_2;
  exe_dir._M_string_length = 0;
  errorMsg._M_dataplus._M_p = (pointer)&errorMsg.field_2;
  errorMsg._M_string_length = 0;
  exe_dir.field_2._M_local_buf[0] = '\0';
  errorMsg.field_2._M_local_buf[0] = '\0';
  exe._M_dataplus._M_p = (pointer)&exe.field_2;
  exe._M_string_length = 0;
  exe.field_2._M_local_buf[0] = '\0';
  bVar1 = cmsys::SystemTools::FindProgramPath
                    (argv0,&exe,&errorMsg,(char *)0x0,(char *)0x0,(char *)0x0);
  if (bVar1) {
    cmsys::SystemTools::GetRealPath((string *)&fin,&exe,(string *)0x0);
    std::__cxx11::string::operator=((string *)&exe,(string *)&fin);
    std::__cxx11::string::~string((string *)&fin);
    cmsys::SystemTools::GetFilenamePath((string *)&fin,&exe);
    std::__cxx11::string::operator=((string *)&exe_dir,(string *)&fin);
    std::__cxx11::string::~string((string *)&fin);
  }
  cmsys::SystemTools::GetActualCaseForPath((string *)&fin,&exe_dir);
  std::__cxx11::string::operator=((string *)&exe_dir,(string *)&fin);
  std::__cxx11::string::~string((string *)&fin);
  _fin = (pointer)exe_dir._M_string_length;
  _fin2 = (pointer)0x6;
  dir._M_dataplus._M_p = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<char_const*>(&prefix,(cmAlphaNum *)&fin,(cmAlphaNum *)&fin2,(char **)&dir);
  std::__cxx11::string::operator=((string *)&cmSystemToolsCMakeCommand_abi_cxx11_,(string *)&prefix)
  ;
  std::__cxx11::string::~string((string *)&prefix);
  _fin = (pointer)exe_dir._M_string_length;
  _fin2 = (pointer)0x6;
  dir._M_dataplus._M_p = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<char_const*>(&prefix,(cmAlphaNum *)&fin,(cmAlphaNum *)&fin2,(char **)&dir);
  std::__cxx11::string::operator=((string *)&cmSystemToolsCTestCommand_abi_cxx11_,(string *)&prefix)
  ;
  std::__cxx11::string::~string((string *)&prefix);
  _fin = (pointer)exe_dir._M_string_length;
  _fin2 = (pointer)0x6;
  dir._M_dataplus._M_p = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<char_const*>(&prefix,(cmAlphaNum *)&fin,(cmAlphaNum *)&fin2,(char **)&dir);
  std::__cxx11::string::operator=((string *)&cmSystemToolsCPackCommand_abi_cxx11_,(string *)&prefix)
  ;
  std::__cxx11::string::~string((string *)&prefix);
  _fin = (pointer)exe_dir._M_string_length;
  _fin2 = (pointer)0xa;
  dir._M_dataplus._M_p = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<char_const*>(&prefix,(cmAlphaNum *)&fin,(cmAlphaNum *)&fin2,(char **)&dir);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMakeGUICommand_abi_cxx11_,(string *)&prefix);
  std::__cxx11::string::~string((string *)&prefix);
  bVar1 = cmsys::SystemTools::FileExists(&cmSystemToolsCMakeGUICommand_abi_cxx11_);
  if (!bVar1) {
    cmSystemToolsCMakeGUICommand_abi_cxx11_._M_string_length = 0;
    *cmSystemToolsCMakeGUICommand_abi_cxx11_._M_dataplus._M_p = '\0';
  }
  _fin = (pointer)exe_dir._M_string_length;
  _fin2 = (pointer)0x7;
  dir._M_dataplus._M_p = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<char_const*>(&prefix,(cmAlphaNum *)&fin,(cmAlphaNum *)&fin2,(char **)&dir);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMakeCursesCommand_abi_cxx11_,(string *)&prefix);
  std::__cxx11::string::~string((string *)&prefix);
  bVar1 = cmsys::SystemTools::FileExists(&cmSystemToolsCMakeCursesCommand_abi_cxx11_);
  if (!bVar1) {
    cmSystemToolsCMakeCursesCommand_abi_cxx11_._M_string_length = 0;
    *cmSystemToolsCMakeCursesCommand_abi_cxx11_._M_dataplus._M_p = '\0';
  }
  _fin = (pointer)exe_dir._M_string_length;
  _fin2 = (pointer)0x9;
  dir._M_dataplus._M_p = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<char_const*>(&prefix,(cmAlphaNum *)&fin,(cmAlphaNum *)&fin2,(char **)&dir);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMClDepsCommand_abi_cxx11_,(string *)&prefix);
  std::__cxx11::string::~string((string *)&prefix);
  bVar1 = cmsys::SystemTools::FileExists(&cmSystemToolsCMClDepsCommand_abi_cxx11_);
  if (!bVar1) {
    cmSystemToolsCMClDepsCommand_abi_cxx11_._M_string_length = 0;
    *cmSystemToolsCMClDepsCommand_abi_cxx11_._M_dataplus._M_p = '\0';
  }
  str._M_str = exe_dir._M_dataplus._M_p;
  str._M_len = exe_dir._M_string_length;
  bVar1 = cmHasLiteralSuffix<5ul>(str,(char (*) [5])"/bin");
  if (bVar1) {
    std::__cxx11::string::substr((ulong)&prefix,(ulong)&exe_dir);
    _fin = (pointer)prefix._M_string_length;
    _fin2 = &DAT_00000011;
    cmStrCat<>(&dir,(cmAlphaNum *)&fin,(cmAlphaNum *)&fin2);
    std::__cxx11::string::operator=((string *)&cmSystemToolsCMakeRoot_abi_cxx11_,(string *)&dir);
    std::__cxx11::string::~string((string *)&dir);
    _fin = (pointer)prefix._M_string_length;
    _fin2 = (pointer)0x1f;
    cmStrCat<>(&dir,(cmAlphaNum *)&fin,(cmAlphaNum *)&fin2);
    bVar1 = cmsys::SystemTools::FileExists(&dir);
    std::__cxx11::string::~string((string *)&dir);
    if (bVar1) {
      _fin = (pointer)prefix._M_string_length;
      _fin2 = (pointer)0x14;
      cmStrCat<>(&dir,(cmAlphaNum *)&fin,(cmAlphaNum *)&fin2);
      std::__cxx11::string::operator=((string *)&cmSystemToolsHTMLDoc_abi_cxx11_,(string *)&dir);
      std::__cxx11::string::~string((string *)&dir);
    }
    std::__cxx11::string::~string((string *)&prefix);
  }
  if (cmSystemToolsCMakeRoot_abi_cxx11_._M_string_length != 0) {
    _fin = (pointer)cmSystemToolsCMakeRoot_abi_cxx11_._M_string_length;
    _fin2 = (pointer)0x14;
    cmStrCat<>(&prefix,(cmAlphaNum *)&fin,(cmAlphaNum *)&fin2);
    bVar1 = cmsys::SystemTools::FileExists(&prefix);
    std::__cxx11::string::~string((string *)&prefix);
    if (bVar1) goto LAB_00115047;
  }
  cmsys::SystemTools::GetFilenamePath(&dir,&exe_dir);
  _fin = (pointer)dir._M_string_length;
  _fin2 = (pointer)0x1e;
  cmStrCat<>(&src_dir_txt,(cmAlphaNum *)&fin,(cmAlphaNum *)&fin2);
  std::ifstream::ifstream(&fin,src_dir_txt._M_dataplus._M_p,_S_in);
  src_dir._M_dataplus._M_p = (pointer)&src_dir.field_2;
  src_dir._M_string_length = 0;
  src_dir.field_2._M_local_buf[0] = '\0';
  if ((abStack_200[*(long *)(_fin + -0x18)] & 5) == 0) {
    bVar1 = cmsys::SystemTools::GetLineFromStream
                      ((istream *)&fin,&src_dir,(bool *)0x0,0xffffffffffffffff);
    if (!bVar1) goto LAB_00114e54;
    bVar1 = cmsys::SystemTools::FileIsDirectory(&src_dir);
    if (!bVar1) goto LAB_00114e54;
    std::__cxx11::string::_M_assign((string *)&cmSystemToolsCMakeRoot_abi_cxx11_);
  }
  else {
LAB_00114e54:
    cmsys::SystemTools::GetFilenamePath((string *)&fin2,&dir);
    std::__cxx11::string::operator=((string *)&dir,(string *)&fin2);
    std::__cxx11::string::~string((string *)&fin2);
    _fin2 = (pointer)dir._M_string_length;
    prefix._M_dataplus._M_p = (pointer)0x1e;
    prefix._M_string_length = (size_type)anon_var_dwarf_16da2;
    cmStrCat<>(&local_4a8,(cmAlphaNum *)&fin2,(cmAlphaNum *)&prefix);
    std::__cxx11::string::operator=((string *)&src_dir_txt,(string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::ifstream::ifstream(&fin2,src_dir_txt._M_dataplus._M_p,_S_in);
    if ((abStack_408[*(long *)(_fin2 + -0x18)] & 5) == 0) {
      bVar1 = cmsys::SystemTools::GetLineFromStream
                        ((istream *)&fin2,&src_dir,(bool *)0x0,0xffffffffffffffff);
      if (bVar1) {
        bVar1 = cmsys::SystemTools::FileIsDirectory(&src_dir);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)&cmSystemToolsCMakeRoot_abi_cxx11_);
        }
      }
    }
    std::ifstream::~ifstream(&fin2);
  }
  if ((cmSystemToolsCMakeRoot_abi_cxx11_._M_string_length != 0) &&
     (cmSystemToolsHTMLDoc_abi_cxx11_._M_string_length == 0)) {
    _fin2 = (pointer)dir._M_string_length;
    prefix._M_dataplus._M_p = (pointer)0x21;
    prefix._M_string_length = (size_type)anon_var_dwarf_16dbc;
    cmStrCat<>(&local_4a8,(cmAlphaNum *)&fin2,(cmAlphaNum *)&prefix);
    bVar1 = cmsys::SystemTools::FileExists(&local_4a8);
    std::__cxx11::string::~string((string *)&local_4a8);
    if (bVar1) {
      _fin2 = (pointer)dir._M_string_length;
      prefix._M_dataplus._M_p = (pointer)0x16;
      prefix._M_string_length = (size_type)anon_var_dwarf_16dd6;
      cmStrCat<>(&local_4a8,(cmAlphaNum *)&fin2,(cmAlphaNum *)&prefix);
      std::__cxx11::string::operator=
                ((string *)&cmSystemToolsHTMLDoc_abi_cxx11_,(string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_4a8);
    }
  }
  std::__cxx11::string::~string((string *)&src_dir);
  std::ifstream::~ifstream(&fin);
  std::__cxx11::string::~string((string *)&src_dir_txt);
  std::__cxx11::string::~string((string *)&dir);
LAB_00115047:
  std::__cxx11::string::~string((string *)&exe);
  std::__cxx11::string::~string((string *)&errorMsg);
  std::__cxx11::string::~string((string *)&exe_dir);
  return;
}

Assistant:

void cmSystemTools::ExpandRegistryValues(std::string& source,
                                         KeyWOW64 /*unused*/)
{
  cmsys::RegularExpression regEntry("\\[(HKEY[^]]*)\\]");
  while (regEntry.find(source)) {
    // the arguments are the second match
    std::string key = regEntry.match(1);
    std::string reg = cmStrCat('[', key, ']');
    cmSystemTools::ReplaceString(source, reg.c_str(), "/registry");
  }
}